

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

ArrayFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_multiarraytype(FeatureType *this)

{
  ArrayFeatureType *pAVar1;
  ArrayFeatureType *_msg;
  FeatureType *this_local;
  
  pAVar1 = _internal_mutable_multiarraytype(this);
  return pAVar1;
}

Assistant:

inline ::CoreML::Specification::ArrayFeatureType* FeatureType::mutable_multiarraytype() {
  ::CoreML::Specification::ArrayFeatureType* _msg = _internal_mutable_multiarraytype();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.multiArrayType)
  return _msg;
}